

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O2

uint embree::postIntersect(TutorialData *data,Ray *ray,DifferentialGeometry *dg)

{
  float fVar1;
  uint uVar2;
  uint primID;
  ISPCType IVar3;
  ISPCInstanceArray *instanceArray;
  RTCGeometry pRVar4;
  bool bVar5;
  ISPCInstance *instance;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float fStack_a8;
  float local_a4;
  float fStack_a0;
  float fStack_98;
  float local_94;
  float fStack_90;
  RTCGeometry local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pRVar4 = (RTCGeometry)data->ispc_scene->geometries;
  uVar2 = ray->instID[0];
  primID = ray->instPrimID[0];
  fVar1 = (ray->dir).field_0.m128[3];
  bVar5 = true;
  local_68 = 0.0;
  fStack_64 = 0.0;
  fStack_60 = 1.0;
  fStack_5c = 0.0;
  local_58 = 0.0;
  fStack_54 = 1.0;
  fStack_50 = 0.0;
  fStack_4c = 0.0;
  fVar10 = 1.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  local_70 = pRVar4;
  do {
    if (!bVar5) {
LAB_0011e97b:
      uVar2 = *(uint *)(*(long *)(pRVar4 + (ulong)ray->geomID * 8) + 0x10);
      fVar1 = (dg->Ng).field_0.m128[0];
      fVar6 = (dg->Ng).field_0.m128[1];
      fVar7 = (dg->Ng).field_0.m128[2];
      (dg->Ng).field_0.m128[0] = fVar1 * fVar10 + fVar6 * local_58 + fVar7 * local_68;
      (dg->Ng).field_0.m128[1] = fVar1 * fVar11 + fVar6 * fStack_54 + fVar7 * fStack_64;
      (dg->Ng).field_0.m128[2] = fVar1 * fVar12 + fVar6 * fStack_50 + fVar7 * fStack_60;
      (dg->Ng).field_0.m128[3] = fVar1 * fVar13 + fVar6 * fStack_4c + fVar7 * fStack_5c;
      fVar1 = (dg->Ns).field_0.m128[0];
      fVar6 = (dg->Ns).field_0.m128[1];
      fVar7 = (dg->Ns).field_0.m128[2];
      (dg->Ns).field_0.m128[0] = fVar1 * fVar10 + fVar6 * local_58 + fVar7 * local_68;
      (dg->Ns).field_0.m128[1] = fVar1 * fVar11 + fVar6 * fStack_54 + fVar7 * fStack_64;
      (dg->Ns).field_0.m128[2] = fVar1 * fVar12 + fVar6 * fStack_50 + fVar7 * fStack_60;
      (dg->Ns).field_0.m128[3] = fVar1 * fVar13 + fVar6 * fStack_4c + fVar7 * fStack_5c;
      return uVar2;
    }
    if (uVar2 == 0xffffffff) {
      fVar10 = 1.0;
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      local_58 = 0.0;
      fStack_54 = 1.0;
      fStack_50 = 0.0;
      fStack_4c = 0.0;
      local_68 = 0.0;
      fStack_64 = 0.0;
      fStack_60 = 1.0;
      fStack_5c = 0.0;
      pRVar4 = local_70;
      goto LAB_0011e97b;
    }
    instanceArray = *(ISPCInstanceArray **)(pRVar4 + (ulong)uVar2 * 8);
    IVar3 = (instanceArray->geom).type;
    local_48 = fVar10;
    fStack_44 = fVar11;
    fStack_40 = fVar12;
    fStack_3c = fVar13;
    if (IVar3 == INSTANCE_ARRAY) {
      calculate_interpolated_space((AffineSpace3fa *)&local_b8.field_1,instanceArray,primID,fVar1);
    }
    else {
      if (IVar3 != INSTANCE) goto LAB_0011e97b;
      calculate_interpolated_space
                ((AffineSpace3fa *)&local_b8.field_1,(ISPCInstance *)instanceArray,fVar1);
    }
    fVar10 = local_b8.m128[0] * local_48 + local_b8.m128[1] * local_58 + local_b8.m128[2] * local_68
    ;
    fVar11 = local_b8.m128[0] * fStack_44 +
             local_b8.m128[1] * fStack_54 + local_b8.m128[2] * fStack_64;
    fVar12 = local_b8.m128[0] * fStack_40 +
             local_b8.m128[1] * fStack_50 + local_b8.m128[2] * fStack_60;
    fVar13 = local_b8.m128[0] * fStack_3c +
             local_b8.m128[1] * fStack_4c + local_b8.m128[2] * fStack_5c;
    fVar6 = local_94 * local_58;
    fVar7 = local_94 * fStack_54;
    fVar8 = local_94 * fStack_50;
    fVar9 = local_94 * fStack_4c;
    local_58 = fStack_a8 * local_48 + local_a4 * local_58 + fStack_a0 * local_68;
    fStack_54 = fStack_a8 * fStack_44 + local_a4 * fStack_54 + fStack_a0 * fStack_64;
    fStack_50 = fStack_a8 * fStack_40 + local_a4 * fStack_50 + fStack_a0 * fStack_60;
    fStack_4c = fStack_a8 * fStack_3c + local_a4 * fStack_4c + fStack_a0 * fStack_5c;
    local_68 = fStack_98 * local_48 + fVar6 + fStack_90 * local_68;
    fStack_64 = fStack_98 * fStack_44 + fVar7 + fStack_90 * fStack_64;
    fStack_60 = fStack_98 * fStack_40 + fVar8 + fStack_90 * fStack_60;
    fStack_5c = fStack_98 * fStack_3c + fVar9 + fStack_90 * fStack_5c;
    pRVar4 = instanceArray->child[1].geometry;
    bVar5 = false;
  } while( true );
}

Assistant:

unsigned int postIntersect(const TutorialData& data, const Ray& ray, DifferentialGeometry& dg)
{
  AffineSpace3fa local2world = AffineSpace3fa::scale(Vec3fa(1));
  ISPCGeometry** geometries = data.ispc_scene->geometries;
  
  for (int i=0; i<RTC_MAX_INSTANCE_LEVEL_COUNT; i++)
  {
    const unsigned int instID = ray.instID[i];
    if (instID == -1) break;

    if (geometries[instID]->type == INSTANCE) {
      ISPCInstance* instance = (ISPCInstancePtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instance,ray.time());

      assert(instance->child->type == GROUP);
      geometries = ((ISPCGroup*)instance->child)->geometries;
    }
#if defined(RTC_GEOMETRY_INSTANCE_ARRAY)
    else if (geometries[instID]->type == INSTANCE_ARRAY) {
      ISPCInstanceArray* instanceArray = (ISPCInstanceArrayPtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instanceArray,ray.instPrimID[i],ray.time());
      assert(instanceArray->child->type == GROUP);
      geometries = ((ISPCGroup*)instanceArray->child)->geometries;
    }
#endif
  }

  ISPCGeometry* mesh = geometries[ray.geomID];
  unsigned int materialID = mesh->materialID;
  
  dg.Ng = xfmVector(local2world,dg.Ng);
  dg.Ns = xfmVector(local2world,dg.Ns);
  
  return materialID;
}